

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O0

int test_xmlCharEncFirstLine(void)

{
  int iVar1;
  int iVar2;
  xmlBufferPtr val;
  xmlBufferPtr val_00;
  uint local_44;
  int n_in;
  xmlBufferPtr in;
  int n_out;
  xmlBufferPtr out;
  int n_handler;
  xmlCharEncodingHandler *handler;
  int ret_val;
  int mem_base;
  int test_ret;
  
  ret_val = 0;
  for (out._4_4_ = 0; (int)out._4_4_ < 1; out._4_4_ = out._4_4_ + 1) {
    for (in._4_4_ = 0; (int)in._4_4_ < 3; in._4_4_ = in._4_4_ + 1) {
      for (local_44 = 0; (int)local_44 < 3; local_44 = local_44 + 1) {
        iVar1 = xmlMemBlocks();
        val = gen_xmlBufferPtr(in._4_4_,1);
        val_00 = gen_xmlBufferPtr(local_44,2);
        iVar2 = xmlCharEncFirstLine(0,val,val_00);
        desret_int(iVar2);
        call_tests = call_tests + 1;
        des_xmlBufferPtr(in._4_4_,val,1);
        des_xmlBufferPtr(local_44,val_00,2);
        xmlResetLastError();
        iVar2 = xmlMemBlocks();
        if (iVar1 != iVar2) {
          iVar2 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlCharEncFirstLine",(ulong)(uint)(iVar2 - iVar1));
          ret_val = ret_val + 1;
          printf(" %d",(ulong)out._4_4_);
          printf(" %d",(ulong)in._4_4_);
          printf(" %d",(ulong)local_44);
          printf("\n");
        }
      }
    }
  }
  function_tests = function_tests + 1;
  return ret_val;
}

Assistant:

static int
test_xmlCharEncFirstLine(void) {
    int test_ret = 0;

    int mem_base;
    int ret_val;
    xmlCharEncodingHandler * handler; /* char encoding transformation data structure */
    int n_handler;
    xmlBufferPtr out; /* an xmlBuffer for the output. */
    int n_out;
    xmlBufferPtr in; /* an xmlBuffer for the input */
    int n_in;

    for (n_handler = 0;n_handler < gen_nb_xmlCharEncodingHandler_ptr;n_handler++) {
    for (n_out = 0;n_out < gen_nb_xmlBufferPtr;n_out++) {
    for (n_in = 0;n_in < gen_nb_xmlBufferPtr;n_in++) {
        mem_base = xmlMemBlocks();
        handler = gen_xmlCharEncodingHandler_ptr(n_handler, 0);
        out = gen_xmlBufferPtr(n_out, 1);
        in = gen_xmlBufferPtr(n_in, 2);

        ret_val = xmlCharEncFirstLine(handler, out, in);
        desret_int(ret_val);
        call_tests++;
        des_xmlCharEncodingHandler_ptr(n_handler, handler, 0);
        des_xmlBufferPtr(n_out, out, 1);
        des_xmlBufferPtr(n_in, in, 2);
        xmlResetLastError();
        if (mem_base != xmlMemBlocks()) {
            printf("Leak of %d blocks found in xmlCharEncFirstLine",
	           xmlMemBlocks() - mem_base);
	    test_ret++;
            printf(" %d", n_handler);
            printf(" %d", n_out);
            printf(" %d", n_in);
            printf("\n");
        }
    }
    }
    }
    function_tests++;

    return(test_ret);
}